

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Field *pFVar6;
  bool bVar7;
  slot_type *psVar8;
  ulong uVar9;
  size_t sVar10;
  byte bVar11;
  uint *puVar12;
  size_t sVar13;
  ctrl_t cVar14;
  ulong uVar15;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  undefined1 local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>]"
                 );
  }
  sVar10 = common->capacity_;
  if (sVar10 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>]"
                 );
  }
  uVar1 = common->size_;
  if (1 < uVar1 && sVar10 == 1) {
    psVar8 = soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
                       *)common);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)(psVar8->value).first
    ;
    bVar11 = (SUB161(auVar3 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar3 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
    local_40 = (byte)common->size_;
    local_48 = common->capacity_;
  }
  else {
    bVar11 = 0x80;
    local_40 = (byte)uVar1;
    local_48 = sVar10;
  }
  local_40 = local_40 & 1;
  local_3f = sVar10 == 1;
  local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_3e = 1 < uVar1 && sVar10 == 1;
  bVar7 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar11,4,0x10);
  if (local_48 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::json_internal::ResolverPool::Field *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::json_internal::ResolverPool::Field *>>]"
                 );
  }
  if (sVar10 != 1 || 1 < uVar1) {
    psVar8 = slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::json_internal::ResolverPool::Field_*>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
                         *)common);
    if (!bVar7) {
      if (sVar10 == 1) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)local_58._0_4_;
        uVar15 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar15);
        uVar9 = FVar16.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar9) {
LAB_002d976a:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar14 = (ctrl_t)uVar15 & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar9] = cVar14;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar9 - 0xf & uVar1)] = cVar14;
        *(ulong *)(psVar8 + uVar9) = CONCAT44(local_58._4_4_,local_58._0_4_);
        psVar8[uVar9].value.second = (Field *)CONCAT44(local_58._12_4_,local_58._8_4_);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          puVar12 = (uint *)CONCAT44(local_58._12_4_,local_58._8_4_);
          sVar13 = 0;
          sVar10 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar13)) {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)*puVar12;
              uVar15 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar15);
              uVar9 = FVar16.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar9) goto LAB_002d976a;
              cVar14 = (ctrl_t)uVar15 & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar9] = cVar14;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar9 - 0xf & uVar1)] = cVar14;
              pFVar6 = *(Field **)(puVar12 + 2);
              *(undefined8 *)(psVar8 + uVar9) = *(undefined8 *)puVar12;
              psVar8[uVar9].value.second = pFVar6;
              sVar10 = local_48;
            }
            sVar13 = sVar13 + 1;
            puVar12 = puVar12 + 4;
          } while (sVar13 != sVar10);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }